

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5CacheInstArray(Fts5Cursor *pCsr)

{
  int iVar1;
  int iVar2;
  i64 iVar3;
  int iVar4;
  Fts5PoslistReader *pFVar5;
  u8 *puVar6;
  int *pOld;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  Fts5PoslistReader *pIter;
  long lVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  int n;
  u8 *a;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  uVar10 = 0;
  if (pCsr->pExpr != (Fts5Expr *)0x0) {
    uVar10 = pCsr->pExpr->nPhrase;
  }
  iVar1 = *(int *)&((pCsr->base).pVtab[1].pModule)->xDisconnect;
  pFVar5 = pCsr->aInstIter;
  if (pFVar5 == (Fts5PoslistReader *)0x0) {
    pFVar5 = (Fts5PoslistReader *)sqlite3Fts5MallocZero(&local_3c,(long)(int)uVar10 << 5);
    pCsr->aInstIter = pFVar5;
    iVar4 = local_3c;
    if (pFVar5 == (Fts5PoslistReader *)0x0) goto LAB_001cfde1;
  }
  lVar13 = 0;
  pIter = pFVar5;
  iVar4 = local_3c;
  while ((lVar13 < (int)uVar10 && (iVar4 == 0))) {
    a = &DAT_aaaaaaaaaaaaaaaa;
    n = -0x55555556;
    iVar4 = fts5CsrPoslist(pCsr,(int)lVar13,&a,&n);
    if (iVar4 == 0) {
      sqlite3Fts5PoslistReaderInit(a,n,pIter);
    }
    lVar13 = lVar13 + 1;
    pIter = pIter + 1;
  }
  uVar11 = 0;
  if (iVar4 == 0) {
    uVar8 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar8 = 0;
    }
    uVar11 = 0;
    while( true ) {
      uVar7 = 0;
      uVar9 = 0xffffffffffffffff;
      puVar6 = &pFVar5->bEof;
      while( true ) {
        iVar4 = (int)uVar9;
        uVar14 = uVar9 & 0xffffffff;
        if (uVar8 == uVar7) break;
        if ((*puVar6 == '\0') && ((iVar4 < 0 || (*(long *)(puVar6 + 7) < pFVar5[uVar14].iPos)))) {
          uVar9 = uVar7 & 0xffffffff;
        }
        uVar7 = uVar7 + 1;
        puVar6 = puVar6 + 0x20;
      }
      if (iVar4 < 0) {
        iVar4 = 0;
        goto LAB_001cfdd5;
      }
      uVar9 = uVar11 + 1;
      iVar2 = pCsr->nInstAlloc;
      pOld = pCsr->aInst;
      if ((long)iVar2 <= (long)uVar9) {
        iVar12 = iVar2 * 2;
        if (iVar2 == 0) {
          iVar12 = 0x20;
        }
        pOld = (int *)sqlite3_realloc64(pOld,(long)iVar12 * 0xc);
        if (pOld == (int *)0x0) {
          iVar4 = 7;
          goto LAB_001cfdd5;
        }
        pCsr->aInst = pOld;
        pCsr->nInstAlloc = iVar12;
      }
      lVar13 = (long)(uVar9 * 0x300000000 + -0x300000000) >> 0x1e;
      *(int *)((long)pOld + lVar13) = iVar4;
      iVar3 = pFVar5[uVar14].iPos;
      uVar10 = (uint)((ulong)iVar3 >> 0x20) & 0x7fffffff;
      *(uint *)((long)pOld + lVar13 + 4) = uVar10;
      *(uint *)((long)pOld + lVar13 + 8) = (uint)iVar3 & 0x7fffffff;
      if (iVar1 <= (int)uVar10) break;
      sqlite3Fts5PoslistReaderNext(pFVar5 + uVar14);
      uVar11 = uVar9;
    }
    iVar4 = 0x10b;
    uVar11 = uVar9 & 0xffffffff;
  }
LAB_001cfdd5:
  pCsr->nInstCount = (int)uVar11;
  *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xf7;
LAB_001cfde1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5CacheInstArray(Fts5Cursor *pCsr){
  int rc = SQLITE_OK;
  Fts5PoslistReader *aIter;       /* One iterator for each phrase */
  int nIter;                      /* Number of iterators/phrases */
  int nCol = ((Fts5Table*)pCsr->base.pVtab)->pConfig->nCol;

  nIter = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  if( pCsr->aInstIter==0 ){
    sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nIter;
    pCsr->aInstIter = (Fts5PoslistReader*)sqlite3Fts5MallocZero(&rc, nByte);
  }
  aIter = pCsr->aInstIter;

  if( aIter ){
    int nInst = 0;                /* Number instances seen so far */
    int i;

    /* Initialize all iterators */
    for(i=0; i<nIter && rc==SQLITE_OK; i++){
      const u8 *a;
      int n;
      rc = fts5CsrPoslist(pCsr, i, &a, &n);
      if( rc==SQLITE_OK ){
        sqlite3Fts5PoslistReaderInit(a, n, &aIter[i]);
      }
    }

    if( rc==SQLITE_OK ){
      while( 1 ){
        int *aInst;
        int iBest = -1;
        for(i=0; i<nIter; i++){
          if( (aIter[i].bEof==0)
              && (iBest<0 || aIter[i].iPos<aIter[iBest].iPos)
            ){
            iBest = i;
          }
        }
        if( iBest<0 ) break;

        nInst++;
        if( nInst>=pCsr->nInstAlloc ){
          int nNewSize = pCsr->nInstAlloc ? pCsr->nInstAlloc*2 : 32;
          aInst = (int*)sqlite3_realloc64(
              pCsr->aInst, nNewSize*sizeof(int)*3
              );
          if( aInst ){
            pCsr->aInst = aInst;
            pCsr->nInstAlloc = nNewSize;
          }else{
            nInst--;
            rc = SQLITE_NOMEM;
            break;
          }
        }

        aInst = &pCsr->aInst[3 * (nInst-1)];
        aInst[0] = iBest;
        aInst[1] = FTS5_POS2COLUMN(aIter[iBest].iPos);
        aInst[2] = FTS5_POS2OFFSET(aIter[iBest].iPos);
        assert( aInst[1]>=0 );
        if( aInst[1]>=nCol ){
          rc = FTS5_CORRUPT;
          break;
        }
        sqlite3Fts5PoslistReaderNext(&aIter[iBest]);
      }
    }

    pCsr->nInstCount = nInst;
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_INST);
  }
  return rc;
}